

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<char>::dispose(ArrayBuilder<char> *this)

{
  char *pcVar1;
  RemoveConst<char> *pRVar2;
  char *pcVar3;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char *)0x0) {
    pRVar2 = this->pos;
    pcVar3 = this->endPtr;
    this->ptr = (char *)0x0;
    this->pos = (RemoveConst<char> *)0x0;
    this->endPtr = (char *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pcVar1,1,(long)pRVar2 - (long)pcVar1,(long)pcVar3 - (long)pcVar1,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }